

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lzop.c
# Opt level: O0

int lzop_bidder_init(archive_read_filter *self)

{
  int iVar1;
  int r;
  archive_read_filter *self_local;
  
  iVar1 = __archive_read_program(self,"lzop -d");
  self->code = 0xb;
  self->name = "lzop";
  return iVar1;
}

Assistant:

static int
lzop_bidder_init(struct archive_read_filter *self)
{
	int r;

	r = __archive_read_program(self, "lzop -d");
	/* Note: We set the format here even if __archive_read_program()
	 * above fails.  We do, after all, know what the format is
	 * even if we weren't able to read it. */
	self->code = ARCHIVE_FILTER_LZOP;
	self->name = "lzop";
	return (r);
}